

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjPatchFanin(Acb_Ntk_t *p,int iObj,int iFanin,int iFaninNew)

{
  int iVar1;
  uint *puVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar2 = (uint *)Acb_ObjFanins(p,iObj);
  if (iFanin == iFaninNew) {
    __assert_fail("iFanin != iFaninNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x229,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
  uVar5 = 0;
  uVar4 = (ulong)*puVar2;
  if ((int)*puVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (puVar2[uVar5 + 1] == iFanin) {
      puVar2[uVar5 + 1] = iFaninNew;
    }
  }
  if (0 < (p->vFanouts).nSize) {
    pVVar3 = Vec_WecEntry(&p->vFanouts,iFanin);
    iVar1 = Vec_IntRemove(pVVar3,iObj);
    if (iVar1 != 0) {
      pVVar3 = Vec_WecEntry(&p->vFanouts,iFaninNew);
      Vec_IntPush(pVVar3,iObj);
      return;
    }
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0x230,"void Acb_ObjPatchFanin(Acb_Ntk_t *, int, int, int)");
  }
  return;
}

Assistant:

static inline void Acb_ObjPatchFanin( Acb_Ntk_t * p, int iObj, int iFanin, int iFaninNew )
{
    int i, RetValue, * pFanins = Acb_ObjFanins( p, iObj );
    assert( iFanin != iFaninNew );
    for ( i = 0; i < pFanins[0]; i++ )
        if ( pFanins[ 1 + i ] == iFanin )
            pFanins[ 1 + i ] = iFaninNew;
    if ( !Acb_NtkHasObjFanout(p) )
        return;
    RetValue = Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    assert( RetValue );
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFaninNew), iObj );
}